

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCursesMainForm.cxx
# Opt level: O3

void __thiscall cmCursesMainForm::FillCacheManagerFromUI(cmCursesMainForm *this)

{
  string *key;
  cmCursesCacheEntryComposite *pcVar1;
  int iVar2;
  CacheEntryType type;
  char *__s;
  size_t sVar3;
  undefined4 extraout_var;
  cmState *pcVar4;
  _Alloc_hider _Var5;
  pointer ppcVar6;
  string fixedNewValue;
  string fixedOldValue;
  string oldValue;
  string newValue;
  string local_d8;
  string local_b8;
  string local_98;
  string local_78;
  pointer local_58;
  string local_50;
  
  ppcVar6 = (this->Entries->
            super__Vector_base<cmCursesCacheEntryComposite_*,_std::allocator<cmCursesCacheEntryComposite_*>_>
            )._M_impl.super__Vector_impl_data._M_start;
  local_58 = (this->Entries->
             super__Vector_base<cmCursesCacheEntryComposite_*,_std::allocator<cmCursesCacheEntryComposite_*>_>
             )._M_impl.super__Vector_impl_data._M_finish;
  if (ppcVar6 != local_58) {
    do {
      pcVar1 = *ppcVar6;
      key = &pcVar1->Key;
      __s = cmState::GetCacheEntryValue(this->CMakeInstance->State,key);
      if (__s != (char *)0x0) {
        local_98._M_dataplus._M_p = (pointer)&local_98.field_2;
        sVar3 = strlen(__s);
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_98,__s,__s + sVar3);
        iVar2 = (*pcVar1->Entry->_vptr_cmCursesWidget[5])();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_50,(char *)CONCAT44(extraout_var,iVar2),
                   (allocator<char> *)&local_b8);
        local_b8._M_dataplus._M_p = (pointer)&local_b8.field_2;
        local_b8._M_string_length = 0;
        local_b8.field_2._M_local_buf[0] = '\0';
        local_d8._M_dataplus._M_p = (pointer)&local_d8.field_2;
        local_d8._M_string_length = 0;
        local_d8.field_2._M_local_buf[0] = '\0';
        pcVar4 = this->CMakeInstance->State;
        type = cmState::GetCacheEntryType(pcVar4,key);
        FixValue((cmCursesMainForm *)pcVar4,type,&local_98,&local_b8);
        FixValue((cmCursesMainForm *)pcVar4,type,&local_50,&local_d8);
        _Var5._M_p = local_d8._M_dataplus._M_p;
        if ((local_b8._M_string_length != local_d8._M_string_length) ||
           ((local_b8._M_string_length != 0 &&
            (iVar2 = bcmp(local_b8._M_dataplus._M_p,local_d8._M_dataplus._M_p,
                          local_b8._M_string_length), iVar2 != 0)))) {
          pcVar4 = this->CMakeInstance->State;
          local_78._M_dataplus._M_p = (pointer)&local_78.field_2;
          std::__cxx11::string::_M_construct<char_const*>((string *)&local_78,"MODIFIED","");
          cmState::SetCacheEntryBoolProperty(pcVar4,key,&local_78,true);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_78._M_dataplus._M_p != &local_78.field_2) {
            operator_delete(local_78._M_dataplus._M_p,local_78.field_2._M_allocated_capacity + 1);
          }
          cmState::SetCacheEntryValue(this->CMakeInstance->State,key,&local_d8);
          _Var5._M_p = local_d8._M_dataplus._M_p;
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)_Var5._M_p != &local_d8.field_2) {
          operator_delete(_Var5._M_p,
                          CONCAT71(local_d8.field_2._M_allocated_capacity._1_7_,
                                   local_d8.field_2._M_local_buf[0]) + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_b8._M_dataplus._M_p != &local_b8.field_2) {
          operator_delete(local_b8._M_dataplus._M_p,
                          CONCAT71(local_b8.field_2._M_allocated_capacity._1_7_,
                                   local_b8.field_2._M_local_buf[0]) + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_50._M_dataplus._M_p != &local_50.field_2) {
          operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_98._M_dataplus._M_p != &local_98.field_2) {
          operator_delete(local_98._M_dataplus._M_p,local_98.field_2._M_allocated_capacity + 1);
        }
      }
      ppcVar6 = ppcVar6 + 1;
    } while (ppcVar6 != local_58);
  }
  return;
}

Assistant:

void cmCursesMainForm::FillCacheManagerFromUI()
{
  for (cmCursesCacheEntryComposite* entry : *this->Entries) {
    const std::string& cacheKey = entry->Key;
    const char* existingValue =
      this->CMakeInstance->GetState()->GetCacheEntryValue(cacheKey);
    if (existingValue) {
      std::string oldValue = existingValue;
      std::string newValue = entry->Entry->GetValue();
      std::string fixedOldValue;
      std::string fixedNewValue;
      cmStateEnums::CacheEntryType t =
        this->CMakeInstance->GetState()->GetCacheEntryType(cacheKey);
      this->FixValue(t, oldValue, fixedOldValue);
      this->FixValue(t, newValue, fixedNewValue);

      if (!(fixedOldValue == fixedNewValue)) {
        // The user has changed the value.  Mark it as modified.
        this->CMakeInstance->GetState()->SetCacheEntryBoolProperty(
          cacheKey, "MODIFIED", true);
        this->CMakeInstance->GetState()->SetCacheEntryValue(cacheKey,
                                                            fixedNewValue);
      }
    }
  }
}